

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorImpl<unsigned_short>::resize(SmallVectorImpl<unsigned_short> *this,size_type N)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = (ulong)*(uint *)(this + 8);
  if (uVar2 <= N) {
    if (N <= uVar2) {
      return;
    }
    if (*(uint *)(this + 0xc) < N) {
      SmallVectorTemplateBase<unsigned_short,_true>::grow
                ((SmallVectorTemplateBase<unsigned_short,_true> *)this,N);
      uVar2 = (ulong)*(uint *)(this + 8);
    }
    lVar1 = *(long *)this;
    for (lVar3 = uVar2 * 2; N * 2 != lVar3; lVar3 = lVar3 + 2) {
      *(undefined2 *)(lVar1 + lVar3) = 0;
    }
  }
  SmallVectorBase::set_size((SmallVectorBase *)this,N);
  return;
}

Assistant:

void resize(size_type N) {
    if (N < this->size()) {
      this->destroy_range(this->begin()+N, this->end());
      this->set_size(N);
    } else if (N > this->size()) {
      if (this->capacity() < N)
        this->grow(N);
      for (auto I = this->end(), E = this->begin() + N; I != E; ++I)
        new (&*I) T();
      this->set_size(N);
    }
  }